

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void __thiscall sznet::net::Connector::start(Connector *this)

{
  EventLoop *this_00;
  _Any_data local_48;
  code *pcStack_38;
  code *pcStack_30;
  
  this->m_connect = true;
  this_00 = this->m_loop;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  pcStack_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(code **)local_48._M_unused._0_8_ = startInLoop;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  *(Connector **)((long)local_48._M_unused._0_8_ + 0x10) = this;
  pcStack_30 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::Connector::*(sznet::net::Connector_*))()>_>
               ::_M_invoke;
  pcStack_38 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::Connector::*(sznet::net::Connector_*))()>_>
               ::_M_manager;
  EventLoop::runInLoop(this_00,(Functor *)&local_48);
  if (pcStack_38 != (code *)0x0) {
    (*pcStack_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void Connector::start()
{
	m_connect = true;
	// FIXME: unsafe
	m_loop->runInLoop(std::bind(&Connector::startInLoop, this));
}